

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O3

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setNamedItemNS(DOMNamedNodeMapImpl *this,DOMNode *arg)

{
  short sVar1;
  short sVar2;
  XMLSize_t XVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar7;
  long lVar8;
  DOMNodeImpl *this_00;
  DOMDocument *pDVar9;
  short *psVar10;
  short *psVar11;
  short *psVar12;
  short *psVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  DOMException *this_01;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  short *psVar14;
  DOMNode *pDVar15;
  DOMNode *pDVar16;
  ulong index;
  MemoryManager **ppMVar17;
  DOMDocument *pDVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
  pDVar6 = (DOMDocument *)CONCAT44(extraout_var,iVar5);
  if (((arg == (DOMNode *)0x0) ||
      (plVar7 = (long *)__dynamic_cast(arg,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                       0xfffffffffffffffe), plVar7 == (long *)0x0)) ||
     (lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7), lVar8 == 0)) {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
  }
  else {
    this_00 = (DOMNodeImpl *)(**(code **)(*plVar7 + 0x10))(plVar7);
    pDVar9 = DOMNodeImpl::getOwnerDocument(this_00);
    if (pDVar9 == pDVar6) {
      bVar4 = readOnly(this);
      if (bVar4) {
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar17 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_06,iVar5) != 0)
           ) {
          iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar17 = (MemoryManager **)(CONCAT44(extraout_var_07,iVar5) + 0x158);
        }
        DOMException::DOMException(this_01,7,0,*ppMVar17);
      }
      else {
        if ((*(uint *)&this_00->flags & 8) == 0) {
          this_00->fOwnerNode = this->fOwnerNode;
          this_00->flags = (ushort)*(uint *)&this_00->flags | 8;
          iVar5 = (*arg->_vptr_DOMNode[0x16])(arg);
          psVar10 = (short *)CONCAT44(extraout_var_00,iVar5);
          iVar5 = (*arg->_vptr_DOMNode[0x18])(arg);
          psVar11 = (short *)CONCAT44(extraout_var_01,iVar5);
          lVar8 = 0;
          do {
            if ((this->fBuckets[lVar8] != (DOMNodeVector *)0x0) &&
               (XVar3 = this->fBuckets[lVar8]->nextFreeSlot, XVar3 != 0)) {
              index = 0;
              do {
                if (index < this->fBuckets[lVar8]->nextFreeSlot) {
                  pDVar15 = this->fBuckets[lVar8]->data[index];
                }
                else {
                  pDVar15 = (DOMNode *)0x0;
                }
                iVar5 = (*pDVar15->_vptr_DOMNode[0x16])(pDVar15);
                psVar12 = (short *)CONCAT44(extraout_var_02,iVar5);
                iVar5 = (*pDVar15->_vptr_DOMNode[0x18])(pDVar15);
                psVar13 = (short *)CONCAT44(extraout_var_03,iVar5);
                if (psVar12 == psVar10) {
LAB_00270bda:
                  if (psVar11 != psVar13) {
                    psVar12 = psVar13;
                    if ((psVar11 == (short *)0x0) || (psVar14 = psVar11, psVar13 == (short *)0x0)) {
                      if (psVar11 == (short *)0x0) {
                        if (psVar13 == (short *)0x0) goto LAB_00270ce5;
LAB_00270c39:
                        sVar1 = *psVar12;
                      }
                      else {
                        sVar1 = *psVar11;
                        if ((psVar13 != (short *)0x0) && (sVar1 == 0)) goto LAB_00270c39;
                      }
                      if (sVar1 == 0) goto LAB_00270ce5;
                    }
                    else {
                      do {
                        sVar1 = *psVar14;
                        if (sVar1 == 0) goto LAB_00270c39;
                        sVar2 = *psVar12;
                        psVar12 = psVar12 + 1;
                        psVar14 = psVar14 + 1;
                      } while (sVar1 == sVar2);
                    }
                    if (psVar13 != (short *)0x0) goto LAB_00270ca7;
                    iVar5 = (*pDVar15->_vptr_DOMNode[2])(pDVar15);
                    psVar12 = (short *)CONCAT44(extraout_var_04,iVar5);
                    if (psVar11 == psVar12) goto LAB_00270ce5;
                    if ((psVar11 != (short *)0x0) && (psVar13 = psVar11, psVar12 != (short *)0x0)) {
                      do {
                        sVar1 = *psVar13;
                        if (sVar1 == 0) goto LAB_00270ca1;
                        sVar2 = *psVar12;
                        psVar12 = psVar12 + 1;
                        psVar13 = psVar13 + 1;
                      } while (sVar1 == sVar2);
                      goto LAB_00270ca7;
                    }
                    if (psVar11 == (short *)0x0) {
                      if (psVar12 == (short *)0x0) goto LAB_00270ce5;
LAB_00270ca1:
                      sVar1 = *psVar12;
                    }
                    else {
                      sVar1 = *psVar11;
                      if ((psVar12 != (short *)0x0) && (sVar1 == 0)) goto LAB_00270ca1;
                    }
                    if (sVar1 != 0) goto LAB_00270ca7;
                  }
LAB_00270ce5:
                  DOMNodeVector::setElementAt(this->fBuckets[lVar8],arg,index);
                  pDVar16 = &pDVar6->super_DOMNode;
                  if (pDVar6 == (DOMDocument *)0x0) {
                    pDVar16 = (DOMNode *)0x0;
                  }
                  plVar7 = (long *)__dynamic_cast(pDVar15,&DOMNode::typeinfo,
                                                  &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                  if ((plVar7 == (long *)0x0) ||
                     (lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7), lVar8 == 0)) {
                    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                    DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  }
                  else {
                    lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7);
                    *(DOMNode **)(lVar8 + 8) = pDVar16;
                    plVar7 = (long *)__dynamic_cast(pDVar15,&DOMNode::typeinfo,
                                                    &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                    if ((plVar7 != (long *)0x0) &&
                       (lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7), lVar8 != 0)) {
                      lVar8 = (**(code **)(*plVar7 + 0x10))(plVar7);
                      *(ushort *)(lVar8 + 0x10) = *(ushort *)(lVar8 + 0x10) & 0xfff7;
                      return pDVar15;
                    }
                    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                    DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                  }
                  goto LAB_00270f01;
                }
                psVar14 = psVar10;
                if ((psVar10 == (short *)0x0) || (psVar12 == (short *)0x0)) {
                  if (psVar12 == (short *)0x0) {
                    if (psVar10 == (short *)0x0) goto LAB_00270bda;
LAB_00270bd0:
                    sVar1 = *psVar14;
                  }
                  else {
                    sVar1 = *psVar12;
                    if ((psVar10 != (short *)0x0) && (sVar1 == 0)) goto LAB_00270bd0;
                  }
                  if (sVar1 == 0) goto LAB_00270bda;
                }
                else {
                  do {
                    sVar1 = *psVar12;
                    if (sVar1 == 0) goto LAB_00270bd0;
                    psVar12 = psVar12 + 1;
                    sVar2 = *psVar14;
                    psVar14 = psVar14 + 1;
                  } while (sVar1 == sVar2);
                }
LAB_00270ca7:
                index = index + 1;
              } while (index != XVar3);
            }
            lVar8 = lVar8 + 1;
            if (lVar8 == 0xc1) {
              iVar5 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[2])(this,arg);
              return (DOMNode *)CONCAT44(extraout_var_05,iVar5);
            }
          } while( true );
        }
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar17 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_10,iVar5) != 0)
           ) {
          iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar17 = (MemoryManager **)(CONCAT44(extraout_var_11,iVar5) + 0x158);
        }
        DOMException::DOMException(this_01,10,0,*ppMVar17);
      }
    }
    else {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      ppMVar17 = &XMLPlatformUtils::fgMemoryManager;
      if ((this->fOwnerNode != (DOMNode *)0x0) &&
         (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_08,iVar5) != 0))
      {
        iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        ppMVar17 = (MemoryManager **)(CONCAT44(extraout_var_09,iVar5) + 0x158);
      }
      DOMException::DOMException(this_01,4,0,*ppMVar17);
    }
  }
LAB_00270f01:
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode * DOMNamedNodeMapImpl::setNamedItemNS(DOMNode *arg)
{
    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if (argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR,0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (argImpl->isOwned())
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);

    const XMLCh* namespaceURI=arg->getNamespaceURI();
    const XMLCh* localName=arg->getLocalName();
    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->setElementAt(arg,i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    // if not found, add it using the full name as key
    return setNamedItem(arg);
}